

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  uchar *puVar1;
  uchar uVar2;
  byte bVar3;
  connect_t cVar4;
  connectdata *pcVar5;
  sockaddr *psVar6;
  curl_trc_feat *pcVar7;
  bool bVar8;
  _Bool _Var9;
  ushort uVar10;
  CURLcode CVar11;
  uint uVar12;
  int iVar13;
  CURLproxycode CVar14;
  socks_state *sx;
  long lVar15;
  size_t sVar16;
  ssize_t sVar17;
  size_t __n;
  ulong uVar18;
  CURLproxycode CVar19;
  CURLproxycode extraout_EDX;
  CURLproxycode extraout_EDX_00;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar20;
  undefined7 uVar21;
  undefined7 extraout_var;
  int code;
  ulong uVar22;
  Curl_addrinfo *pCVar23;
  char *pcVar24;
  char *pcVar25;
  Curl_dns_entry *dns;
  Curl_cfilter *local_88;
  connectdata *local_80;
  uchar ip4 [4];
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 extraout_RDX;
  
  if ((cf->field_0x24 & 1) != 0) {
    CVar11 = CURLE_OK;
    _Var9 = true;
    goto LAB_0015af8c;
  }
  sx = (socks_state *)cf->ctx;
  pcVar5 = cf->conn;
  iVar13 = cf->sockindex;
  CVar11 = (*(code *)cf->next->cft->do_connect)(cf->next,data,done);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  local_88 = cf;
  local_80 = pcVar5;
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  if (sx->state == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar15 = 0x138;
    if (((((ulong)local_80->bits & 1) == 0) &&
        (lVar15 = 0xe0, (SUB84(local_80->bits,0) >> 8 & 1) == 0)) && (lVar15 = 0xb0, iVar13 == 1)) {
      lVar15 = 200;
    }
    sx->hostname = *(char **)((long)&(local_80->cpool_node)._list + lVar15);
    if (((ulong)local_80->bits & 1) == 0) {
      if (iVar13 == 1) {
        uVar12 = (uint)local_80->secondary_port;
      }
      else if ((SUB84(local_80->bits,0) >> 9 & 1) == 0) {
        uVar12 = local_80->remote_port;
      }
      else {
        uVar12 = local_80->conn_to_port;
      }
    }
    else {
      uVar12 = (local_80->http_proxy).port;
    }
    sx->remote_port = uVar12;
    sx->proxy_user = (local_80->socks_proxy).user;
    sx->proxy_password = (local_80->socks_proxy).passwd;
  }
  pcVar5 = cf->conn;
  uVar2 = (pcVar5->socks_proxy).proxytype;
  switch(uVar2) {
  case '\x04':
  case '\x06':
    puVar1 = sx->buffer;
    dns = (Curl_dns_entry *)0x0;
    switch(sx->state) {
    case CONNECT_SOCKS_INIT:
      pcVar5->ip_version = '\x01';
      if ((((data != (Curl_easy *)0x0) && (((ulong)pcVar5->bits & 1) != 0)) &&
          (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        pcVar25 = "";
        if (uVar2 == '\x06') {
          pcVar25 = "a";
        }
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar25,sx->hostname,
                   (ulong)(uint)sx->remote_port);
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
      iVar13 = sx->remote_port;
      uVar10 = (ushort)iVar13;
      sx->buffer[0] = '\x04';
      sx->buffer[1] = '\x01';
      *(ushort *)(sx->buffer + 2) = uVar10 << 8 | uVar10 >> 8;
      if (uVar2 == '\x06') {
        if (sx->state != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
        goto switchD_0015b01f_caseD_9;
      }
      CVar11 = Curl_resolv(data,sx->hostname,iVar13,(uint)cf->conn->ip_version,true,&dns);
      if (CVar11 == CURLE_OK) {
        if (sx->state != CONNECT_RESOLVED) {
          sx->state = CONNECT_RESOLVED;
        }
        goto switchD_0015b01f_caseD_b;
      }
      CVar14 = CURLPX_RESOLVE_HOST;
      if (CVar11 != CURLE_AGAIN) break;
      if (sx->state != CONNECT_RESOLVING) {
        sx->state = CONNECT_RESOLVING;
      }
      CVar14 = CURLPX_OK;
      if (((data == (Curl_easy *)0x0) || (((data->set).field_0x89f & 0x40) == 0)) ||
         ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 && (pcVar7->log_level < 1))))
      break;
      pcVar25 = sx->hostname;
      pcVar24 = "SOCKS4 non-blocking resolve of %s";
LAB_0015b7c0:
      Curl_infof(data,pcVar24,pcVar25);
LAB_0015b68f:
      CVar14 = CURLPX_OK;
      break;
    default:
switchD_0015b01f_caseD_2:
      if (*puVar1 == '\0') {
        switch(sx->buffer[1]) {
        case 'Z':
          CVar14 = CURLPX_OK;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
              (0 < pcVar7->log_level)))) {
            pcVar25 = "";
            if (uVar2 == '\x06') {
              pcVar25 = "a";
            }
            pcVar24 = "SOCKS4%s request granted.";
            goto LAB_0015b7c0;
          }
          break;
        case '[':
          Curl_failf(data,
                     "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                     ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                     (ulong)sx->buffer[7],
                     (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                    *(ushort *)(sx->buffer + 2) >> 8),0x5b);
          CVar14 = CURLPX_REQUEST_FAILED;
          break;
        case '\\':
          Curl_failf(data,
                     "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                     ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                     (ulong)sx->buffer[7],
                     (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                    *(ushort *)(sx->buffer + 2) >> 8),0x5c);
          CVar14 = CURLPX_IDENTD;
          break;
        case ']':
          Curl_failf(data,
                     "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                     ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                     (ulong)sx->buffer[7],
                     (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                    *(ushort *)(sx->buffer + 2) >> 8),0x5d);
          CVar14 = CURLPX_IDENTD_DIFFER;
          break;
        default:
          Curl_failf(data,"cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                     (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                     (ulong)sx->buffer[7],
                     (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                    *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
          CVar14 = CURLPX_UNKNOWN_FAIL;
        }
      }
      else {
        Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
        CVar14 = CURLPX_BAD_VERSION;
      }
      break;
    case CONNECT_SOCKS_READ:
switchD_0015b01f_caseD_4:
      CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
      if (CVar14 == CURLPX_OK) {
        if (sx->outstanding != 0) goto LAB_0015b68f;
        if (sx->state != CONNECT_DONE) {
          sx->state = CONNECT_DONE;
        }
        goto switchD_0015b01f_caseD_2;
      }
      break;
    case CONNECT_REQ_INIT:
switchD_0015b01f_caseD_9:
      sx->buffer[8] = '\0';
      pcVar25 = sx->proxy_user;
      if (pcVar25 == (char *)0x0) {
LAB_0015b554:
        CVar14 = CURLPX_RESOLVE_HOST;
        sVar16 = strlen((char *)(sx->buffer + 8));
        uVar18 = sVar16 + 9;
        if (uVar2 == '\x06') {
          sx->buffer[4] = '\0';
          sx->buffer[5] = '\0';
          sx->buffer[6] = '\0';
          sx->buffer[7] = '\x01';
          pcVar25 = sx->hostname;
          sVar16 = strlen(pcVar25);
          if ((sVar16 + 1 < 0x100) && (uVar22 = sVar16 + 1 + uVar18, uVar22 < 600)) {
            strcpy((char *)(puVar1 + uVar18),pcVar25);
            bVar8 = true;
            uVar18 = uVar22;
          }
          else {
            bVar8 = false;
            Curl_failf(data,"SOCKS4: too long hostname");
            CVar14 = CURLPX_LONG_HOSTNAME;
          }
          if (bVar8) goto LAB_0015b5ed;
          bVar8 = false;
        }
        else {
LAB_0015b5ed:
          sx->outp = puVar1;
          sx->outstanding = uVar18;
          bVar8 = true;
          if (sx->state != CONNECT_REQ_SENDING) {
            sx->state = CONNECT_REQ_SENDING;
          }
        }
        if (bVar8) goto switchD_0015b01f_caseD_e;
      }
      else {
        sVar16 = strlen(pcVar25);
        if (sVar16 < 0x100) {
          memcpy(sx->buffer + 8,pcVar25,sVar16 + 1);
          cf = local_88;
          goto LAB_0015b554;
        }
        Curl_failf(data,"Too long SOCKS proxy username");
        CVar14 = CURLPX_LONG_USER;
        cf = local_88;
      }
      break;
    case CONNECT_RESOLVING:
      CVar11 = Curl_resolv_check(data,&dns);
      if (dns == (Curl_dns_entry *)0x0) {
        CVar14 = CURLPX_RESOLVE_HOST;
        if (CVar11 == CURLE_OK) {
          CVar14 = CURLPX_OK;
        }
        break;
      }
    case CONNECT_RESOLVED:
switchD_0015b01f_caseD_b:
      if (dns == (Curl_dns_entry *)0x0) {
        pcVar25 = sx->hostname;
        pcVar24 = "Failed to resolve \"%s\" for SOCKS4 connect.";
      }
      else {
        for (pCVar23 = dns->addr; pCVar23 != (Curl_addrinfo *)0x0; pCVar23 = pCVar23->ai_next) {
          if (pCVar23->ai_family == 2) {
            Curl_printable_address(pCVar23,(char *)ip4,0x40);
            psVar6 = pCVar23->ai_addr;
            sx->buffer[4] = psVar6->sa_data[2];
            sx->buffer[5] = psVar6->sa_data[3];
            sx->buffer[6] = psVar6->sa_data[4];
            sx->buffer[7] = psVar6->sa_data[5];
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",ip4);
            }
            Curl_resolv_unlink(data,&dns);
            goto switchD_0015b01f_caseD_9;
          }
        }
        pcVar25 = sx->hostname;
        pcVar24 = "SOCKS4 connection to %s not supported";
      }
      Curl_failf(data,pcVar24,pcVar25);
      CVar14 = CURLPX_RESOLVE_HOST;
      break;
    case CONNECT_REQ_SENDING:
switchD_0015b01f_caseD_e:
      CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
      if (CVar14 == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outstanding = 8;
          sx->outp = puVar1;
          if (sx->state != CONNECT_SOCKS_READ) {
            sx->state = CONNECT_SOCKS_READ;
          }
          goto switchD_0015b01f_caseD_4;
        }
        goto LAB_0015b68f;
      }
    }
    CVar11 = CURLE_OK;
    break;
  case '\x05':
  case '\a':
    pcVar25 = sx->hostname;
    sVar16 = strlen(pcVar25);
    CVar19 = (CURLproxycode)extraout_RDX;
    bVar3 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    lVar15 = 0;
    if (0xf < sx->state - CONNECT_SOCKS_INIT) goto switchD_0015b15f_caseD_5;
    puVar1 = sx->buffer;
    uVar20 = extraout_RDX;
    CVar14 = CVar19;
    switch(sx->state) {
    case CONNECT_SOCKS_INIT:
      if (((data != (Curl_easy *)0x0) && (((ulong)pcVar5->bits & 1) != 0)) &&
         ((((data->set).field_0x89f & 0x40) != 0 &&
          ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))
          ))) {
        Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar25,
                   (ulong)(uint)sx->remote_port);
      }
      if ((uVar2 == '\x05') || (sVar16 < 0x100)) {
        if ((((bVar3 & 0xfa) != 0 && data != (Curl_easy *)0x0) &&
            (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                     (ulong)bVar3);
        }
        if ((bVar3 & 1) == 0) {
          sx->proxy_user = (char *)0x0;
        }
        sx->buffer[0] = '\x05';
        sx->buffer[2] = '\0';
        if (sx->proxy_user == (char *)0x0) {
          sVar17 = 3;
        }
        else {
          sx->buffer[3] = '\x02';
          sVar17 = 4;
        }
        sx->buffer[1] = (char)sVar17 + 0xfe;
        sx->outp = puVar1;
        sx->outstanding = sVar17;
        CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar14 != CURLPX_OK) goto LAB_0015c22f;
        if (sx->outstanding == 0) {
          if (sx->state != CONNECT_SOCKS_READ) {
            sx->state = CONNECT_SOCKS_READ;
          }
          goto switchD_0015b15f_caseD_3;
        }
        goto LAB_0015c229;
      }
      Curl_failf(data,
                 "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy."
                );
      CVar14 = CURLPX_LONG_HOSTNAME;
      goto LAB_0015c22f;
    case CONNECT_SOCKS_SEND:
      CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
      if (CVar14 != CURLPX_OK) goto LAB_0015c22f;
      if (sx->outstanding == 0) goto switchD_0015b15f_caseD_3;
      goto LAB_0015c1fd;
    case CONNECT_SOCKS_READ_INIT:
switchD_0015b15f_caseD_3:
      sx->outstanding = 2;
      sx->outp = puVar1;
    case CONNECT_SOCKS_READ:
      CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
      if (CVar14 != CURLPX_OK) goto LAB_0015c22f;
      if (sx->outstanding != 0) goto LAB_0015c229;
      if (*puVar1 != '\x05') {
        pcVar25 = "Received invalid version in initial SOCKS5 response.";
        goto LAB_0015c131;
      }
      bVar3 = sx->buffer[1];
      if (1 < bVar3) {
        if (bVar3 != 2) {
          if (bVar3 != 0xff) goto LAB_0015b9b1;
          Curl_failf(data,"No authentication method was acceptable.");
          CVar14 = CURLPX_NO_AUTH;
          goto LAB_0015c22f;
        }
        uVar20 = extraout_RDX_00;
        if (sx->state != CONNECT_AUTH_INIT) {
          sx->state = CONNECT_AUTH_INIT;
        }
switchD_0015b15f_caseD_6:
        pcVar25 = sx->proxy_user;
        if ((pcVar25 == (char *)0x0) || (pcVar24 = sx->proxy_password, pcVar24 == (char *)0x0)) {
          __n = 0;
          uVar18 = 0;
        }
        else {
          __n = strlen(pcVar25);
          uVar18 = strlen(pcVar24);
          uVar20 = extraout_RDX_01;
        }
        sx->buffer[0] = '\x01';
        sx->buffer[1] = (uchar)__n;
        uVar21 = (undefined7)((ulong)uVar20 >> 8);
        if (__n == 0 || pcVar25 == (char *)0x0) {
LAB_0015babd:
          sx->buffer[__n + 2] = (uchar)uVar18;
          lVar15 = __n + 3;
          pcVar25 = sx->proxy_password;
          CVar14 = (CURLproxycode)CONCAT71(uVar21,pcVar25 != (char *)0x0);
          if (uVar18 != 0 && pcVar25 != (char *)0x0) {
            if (0xff < uVar18) {
              Curl_failf(data,"Excessive password length for proxy auth");
              CVar14 = CURLPX_LONG_PASSWD;
              goto LAB_0015bb14;
            }
            memcpy(puVar1 + lVar15,pcVar25,uVar18);
            CVar14 = extraout_EDX_00;
          }
          lVar15 = lVar15 + uVar18;
          if (sx->state != CONNECT_AUTH_SEND) {
            sx->state = CONNECT_AUTH_SEND;
          }
          sx->outstanding = lVar15;
          sx->outp = puVar1;
          bVar8 = true;
        }
        else {
          if (__n < 0x100) {
            memcpy(sx->buffer + 2,pcVar25,__n);
            uVar21 = extraout_var;
            goto LAB_0015babd;
          }
          Curl_failf(data,"Excessive username length for proxy auth");
          CVar14 = CURLPX_LONG_USER;
          lVar15 = 2;
LAB_0015bb14:
          bVar8 = false;
        }
        CVar19 = CVar14;
        if (!bVar8) goto LAB_0015c22f;
switchD_0015b15f_caseD_7:
        CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request");
        if (CVar14 != CURLPX_OK) goto LAB_0015c22f;
        if (sx->outstanding == 0) {
          sx->outp = puVar1;
          sx->outstanding = 2;
          if (sx->state != CONNECT_AUTH_READ) {
            sx->state = CONNECT_AUTH_READ;
          }
switchD_0015b15f_caseD_8:
          CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_AUTH,"SOCKS5 sub-negotiation response");
          if (CVar14 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0015c229;
            if (sx->buffer[1] == '\0') {
              cVar4 = sx->state;
              CVar14 = CVar19;
              goto LAB_0015bc5c;
            }
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
            CVar14 = CURLPX_USER_REJECTED;
          }
          goto LAB_0015c22f;
        }
        goto LAB_0015c1fd;
      }
      if (bVar3 == 0) {
        lVar15 = 0;
        cVar4 = sx->state;
        CVar14 = (CURLproxycode)extraout_RDX_00;
LAB_0015bc5c:
        if (cVar4 != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
switchD_0015b15f_caseD_9:
        if (uVar2 == '\x05') {
          CVar11 = Curl_resolv(data,sx->hostname,sx->remote_port,(uint)cf->conn->ip_version,true,
                               &dns);
          if (CVar11 == CURLE_OK) {
            if (sx->state != CONNECT_RESOLVED) {
              sx->state = CONNECT_RESOLVED;
            }
            break;
          }
          CVar14 = CURLPX_RESOLVE_HOST;
          if (CVar11 == CURLE_AGAIN) {
            CVar14 = CURLPX_OK;
            if (sx->state != CONNECT_RESOLVING) {
              sx->state = CONNECT_RESOLVING;
              CVar14 = CURLPX_OK;
            }
          }
          goto LAB_0015c22f;
        }
switchD_0015b15f_caseD_c:
        sx->buffer[0] = '\x05';
        sx->buffer[1] = '\x01';
        sx->buffer[2] = '\0';
        lVar15 = 3;
        if (uVar2 != '\x05') {
          if (((pcVar5->bits).field_0x1 & 4) == 0) {
            iVar13 = inet_pton(2,sx->hostname,ip4);
            if (iVar13 == 1) {
              sx->buffer[3] = '\x01';
              *(uchar (*) [4])(sx->buffer + 4) = ip4;
              lVar15 = 8;
            }
            else {
              sx->buffer[3] = '\x03';
              sx->buffer[4] = (uchar)sVar16;
              memcpy(sx->buffer + 5,sx->hostname,sVar16);
              lVar15 = sVar16 + 5;
            }
LAB_0015bdbc:
            bVar8 = true;
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                         (ulong)(uint)sx->remote_port);
            }
          }
          else {
            iVar13 = inet_pton(10,sx->hostname,ip4);
            if (iVar13 == 1) {
              sx->buffer[3] = '\x04';
              *(ulong *)(sx->buffer + 4) = CONCAT44(uStack_74,ip4);
              *(undefined8 *)(sx->buffer + 0xc) = uStack_70;
              lVar15 = 0x14;
              goto LAB_0015bdbc;
            }
            CVar14 = CURLPX_BAD_ADDRESS_TYPE;
            lVar15 = 3;
            bVar8 = false;
          }
          if (!bVar8) goto LAB_0015c22f;
        }
        goto switchD_0015b15f_caseD_d;
      }
      if (bVar3 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        CVar14 = CURLPX_GSSAPI_PERMSG;
      }
      else {
LAB_0015b9b1:
        Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
        CVar14 = CURLPX_UNKNOWN_MODE;
      }
      goto LAB_0015c22f;
    case CONNECT_GSSAPI_INIT:
      goto switchD_0015b15f_caseD_5;
    case CONNECT_AUTH_INIT:
      goto switchD_0015b15f_caseD_6;
    case CONNECT_AUTH_SEND:
      goto switchD_0015b15f_caseD_7;
    case CONNECT_AUTH_READ:
      goto switchD_0015b15f_caseD_8;
    case CONNECT_REQ_INIT:
      goto switchD_0015b15f_caseD_9;
    case CONNECT_RESOLVING:
      CVar11 = Curl_resolv_check(data,&dns);
      if (dns == (Curl_dns_entry *)0x0) {
        CVar14 = CURLPX_RESOLVE_HOST;
        if (CVar11 == CURLE_OK) {
          CVar14 = CURLPX_OK;
        }
        goto LAB_0015c22f;
      }
      lVar15 = 0;
      CVar14 = extraout_EDX;
      break;
    case CONNECT_RESOLVE_REMOTE:
      goto switchD_0015b15f_caseD_c;
    case CONNECT_REQ_SEND:
      goto switchD_0015b15f_caseD_d;
    case CONNECT_REQ_SENDING:
      goto switchD_0015b15f_caseD_e;
    case CONNECT_REQ_READ:
      goto switchD_0015b15f_caseD_f;
    case CONNECT_REQ_READ_MORE:
      goto switchD_0015b15f_caseD_10;
    }
    if (dns == (Curl_dns_entry *)0x0) {
      pCVar23 = (Curl_addrinfo *)0x0;
    }
    else {
      pCVar23 = dns->addr;
    }
    uVar2 = (data->set).ipver;
    if ((uVar2 != '\0') && (pCVar23 != (Curl_addrinfo *)0x0)) {
      do {
        if (pCVar23->ai_family == (uint)(uVar2 != '\x01') * 8 + 2) break;
        pCVar23 = pCVar23->ai_next;
      } while (pCVar23 != (Curl_addrinfo *)0x0);
    }
    if (pCVar23 == (Curl_addrinfo *)0x0) {
      Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
      CVar14 = CURLPX_RESOLVE_HOST;
    }
    else {
      Curl_printable_address(pCVar23,(char *)ip4,0x2e);
      sx->buffer[0] = '\x05';
      sx->buffer[1] = '\x01';
      sx->buffer[2] = '\0';
      if (pCVar23->ai_family == 10) {
        sx->buffer[3] = '\x04';
        psVar6 = pCVar23->ai_addr;
        lVar15 = 0;
        do {
          sx->buffer[lVar15 + 4] = psVar6->sa_data[lVar15 + 6];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x10);
        if ((data == (Curl_easy *)0x0) || (((data->set).field_0x89f & 0x40) == 0)) {
          lVar15 = 0x14;
        }
        else {
          lVar15 = 0x14;
          pcVar7 = (data->state).feat;
          if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
            uVar12 = sx->remote_port;
            pcVar25 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_0015bfdf:
            Curl_infof(data,pcVar25,ip4,(ulong)uVar12);
          }
        }
      }
      else if (pCVar23->ai_family == 2) {
        sx->buffer[3] = '\x01';
        psVar6 = pCVar23->ai_addr;
        lVar15 = 0;
        do {
          sx->buffer[lVar15 + 4] = psVar6->sa_data[lVar15 + 2];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        if ((data == (Curl_easy *)0x0) || (((data->set).field_0x89f & 0x40) == 0)) {
          lVar15 = 8;
        }
        else {
          lVar15 = 8;
          pcVar7 = (data->state).feat;
          if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
            uVar12 = sx->remote_port;
            pcVar25 = "SOCKS5 connect to %s:%d (locally resolved)";
            goto LAB_0015bfdf;
          }
        }
      }
      else {
        Curl_failf(data,"SOCKS5 connection to %s not supported",ip4);
        lVar15 = 3;
      }
      Curl_resolv_unlink(data,&dns);
    }
    if (pCVar23 != (Curl_addrinfo *)0x0) {
switchD_0015b15f_caseD_d:
      sx->buffer[lVar15] = *(uchar *)((long)&sx->remote_port + 1);
      sx->buffer[lVar15 + 1] = (uchar)sx->remote_port;
      sx->outp = puVar1;
      sx->outstanding = lVar15 + 2;
      if (sx->state != CONNECT_REQ_SENDING) {
        sx->state = CONNECT_REQ_SENDING;
      }
switchD_0015b15f_caseD_e:
      CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
      if (CVar14 == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outstanding = 10;
          sx->outp = puVar1;
          if (sx->state != CONNECT_REQ_READ) {
            sx->state = CONNECT_REQ_READ;
          }
switchD_0015b15f_caseD_f:
          CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack");
          if (CVar14 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0015c229;
            if (*puVar1 == '\x05') {
              bVar3 = sx->buffer[1];
              if (bVar3 == 0) {
                uVar2 = sx->buffer[3];
                if (uVar2 == '\x01') {
                  lVar15 = 10;
                }
                else if (uVar2 == '\x04') {
                  lVar15 = 0x16;
                }
                else {
                  if (uVar2 != '\x03') {
                    Curl_failf(data,"SOCKS5 reply has wrong address type.");
                    cf = local_88;
                    CVar14 = CURLPX_BAD_ADDRESS_TYPE;
                    goto LAB_0015c22f;
                  }
                  lVar15 = (ulong)sx->buffer[4] + 7;
                }
                cf = local_88;
                if ((uint)lVar15 < 0xb) {
                  cVar4 = sx->state;
                }
                else {
                  sx->outstanding = lVar15 + -10;
                  sx->outp = sx->buffer + 10;
                  if (sx->state != CONNECT_REQ_READ_MORE) {
                    sx->state = CONNECT_REQ_READ_MORE;
                  }
switchD_0015b15f_caseD_10:
                  CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_ADDRESS,
                                            "SOCKS5 connect request address");
                  if (CVar14 != CURLPX_OK) goto LAB_0015c22f;
                  if (sx->outstanding != 0) goto LAB_0015c229;
                  cVar4 = sx->state;
                }
                if (cVar4 != CONNECT_DONE) {
                  sx->state = CONNECT_DONE;
                }
switchD_0015b15f_caseD_5:
                if ((data == (Curl_easy *)0x0) || (((data->set).field_0x89f & 0x40) == 0)) {
LAB_0015c1fd:
                  CVar14 = CURLPX_OK;
                }
                else {
                  pcVar7 = (data->state).feat;
                  if ((pcVar7 == (curl_trc_feat *)0x0) ||
                     (CVar14 = CURLPX_OK, 0 < pcVar7->log_level)) {
                    Curl_infof(data,"SOCKS5 request granted.");
                    goto LAB_0015c229;
                  }
                }
              }
              else {
                Curl_failf(data,"cannot complete SOCKS5 connection to %s. (%d)",sx->hostname,
                           (ulong)bVar3);
                CVar14 = CURLPX_REPLY_UNASSIGNED;
                if (bVar3 < 9) {
                  CVar14 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar3 * 4);
                }
              }
            }
            else {
              pcVar25 = "SOCKS5 reply has wrong version, version should be 5.";
LAB_0015c131:
              Curl_failf(data,pcVar25);
              CVar14 = CURLPX_BAD_VERSION;
            }
          }
        }
        else {
LAB_0015c229:
          CVar14 = CURLPX_OK;
        }
      }
    }
LAB_0015c22f:
    CVar11 = CURLE_OK;
    break;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar14 = CURLPX_OK;
    CVar11 = CURLE_COULDNT_CONNECT;
  }
  if (CVar14 != CURLPX_OK) {
    (data->info).pxcode = CVar14;
    CVar11 = CURLE_PROXY;
  }
  if ((CVar11 == CURLE_OK) && (sx->state == CONNECT_DONE)) {
    cf->field_0x24 = cf->field_0x24 | 1;
    Curl_verboseconnect(data,local_80,cf->sockindex);
    if (cf->ctx != (void *)0x0) {
      (*Curl_cfree)(cf->ctx);
      cf->ctx = (void *)0x0;
    }
  }
  _Var9 = (_Bool)(cf->field_0x24 & 1);
LAB_0015af8c:
  *done = _Var9;
  return CVar11;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn, cf->sockindex);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}